

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O0

void cs_hmac_sha1(uchar *key,size_t keylen,uchar *data,size_t datalen,uchar *out)

{
  byte local_139;
  uchar local_138 [7];
  uchar i;
  uchar tmp_key [20];
  byte local_118 [8];
  uchar buf2 [64];
  uchar buf1 [64];
  undefined1 local_8c [8];
  cs_sha1_ctx ctx;
  uchar *out_local;
  size_t datalen_local;
  uchar *data_local;
  size_t keylen_local;
  uchar *key_local;
  
  ctx.buffer._56_8_ = out;
  data_local = (uchar *)keylen;
  keylen_local = (size_t)key;
  if (0x40 < keylen) {
    cs_sha1_init((cs_sha1_ctx *)local_8c);
    cs_sha1_update((cs_sha1_ctx *)local_8c,key,(uint32_t)keylen);
    cs_sha1_final(local_138,(cs_sha1_ctx *)local_8c);
    keylen_local = (size_t)local_138;
    data_local = (uchar *)0x14;
  }
  memset(buf2 + 0x38,0,0x40);
  memset(local_118,0,0x40);
  memcpy(buf2 + 0x38,(void *)keylen_local,(size_t)data_local);
  memcpy(local_118,(void *)keylen_local,(size_t)data_local);
  for (local_139 = 0; local_139 < 0x40; local_139 = local_139 + 1) {
    buf2[(ulong)local_139 + 0x38] = buf2[(ulong)local_139 + 0x38] ^ 0x36;
    local_118[local_139] = local_118[local_139] ^ 0x5c;
  }
  cs_sha1_init((cs_sha1_ctx *)local_8c);
  cs_sha1_update((cs_sha1_ctx *)local_8c,buf2 + 0x38,0x40);
  cs_sha1_update((cs_sha1_ctx *)local_8c,data,(uint32_t)datalen);
  cs_sha1_final((uchar *)ctx.buffer._56_8_,(cs_sha1_ctx *)local_8c);
  cs_sha1_init((cs_sha1_ctx *)local_8c);
  cs_sha1_update((cs_sha1_ctx *)local_8c,local_118,0x40);
  cs_sha1_update((cs_sha1_ctx *)local_8c,(uchar *)ctx.buffer._56_8_,0x14);
  cs_sha1_final((uchar *)ctx.buffer._56_8_,(cs_sha1_ctx *)local_8c);
  return;
}

Assistant:

void cs_hmac_sha1(const unsigned char *key, size_t keylen,
                  const unsigned char *data, size_t datalen,
                  unsigned char out[20]) {
    cs_sha1_ctx ctx;
    unsigned char buf1[64], buf2[64], tmp_key[20], i;

    if (keylen > sizeof(buf1)) {
        cs_sha1_init(&ctx);
        cs_sha1_update(&ctx, key, keylen);
        cs_sha1_final(tmp_key, &ctx);
        key = tmp_key;
        keylen = sizeof(tmp_key);
    }

    memset(buf1, 0, sizeof(buf1));
    memset(buf2, 0, sizeof(buf2));
    memcpy(buf1, key, keylen);
    memcpy(buf2, key, keylen);

    for (i = 0; i < sizeof(buf1); i++) {
        buf1[i] ^= 0x36;
        buf2[i] ^= 0x5c;
    }

    cs_sha1_init(&ctx);
    cs_sha1_update(&ctx, buf1, sizeof(buf1));
    cs_sha1_update(&ctx, data, datalen);
    cs_sha1_final(out, &ctx);

    cs_sha1_init(&ctx);
    cs_sha1_update(&ctx, buf2, sizeof(buf2));
    cs_sha1_update(&ctx, out, 20);
    cs_sha1_final(out, &ctx);
}